

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O3

Result joypad_read(FileData *file_data,JoypadBuffer **out_buffer)

{
  ulong __size;
  u8 *__src;
  Result RVar1;
  JoypadBuffer *pJVar2;
  JoypadChunk *pJVar3;
  JoypadState *__dest;
  ulong uVar4;
  long lVar5;
  u8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  __size = file_data->size;
  if ((__size & 0xf) == 0) {
    uVar7 = __size >> 4;
    __src = file_data->data;
    if (__size != 0) {
      puVar6 = __src + 9;
      uVar8 = 0;
      uVar4 = 0;
      do {
        lVar9 = uVar8 * 0x10;
        if (*(ulong *)(__src + lVar9) < uVar4) {
          joypad_read_cold_3();
          goto LAB_0019b571;
        }
        lVar5 = -7;
        do {
          if (puVar6[lVar5 + 7] != '\0') {
            joypad_read_cold_2();
            goto LAB_0019b571;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
        uVar8 = uVar8 + 1;
        puVar6 = puVar6 + 0x10;
        uVar4 = *(ulong *)(__src + lVar9);
      } while (uVar8 != uVar7);
    }
    pJVar2 = (JoypadBuffer *)calloc(1,0x48);
    pJVar3 = (JoypadChunk *)calloc(1,0x28);
    __dest = (JoypadState *)calloc(1,__size);
    pJVar3->data = __dest;
    pJVar3->capacity = uVar7;
    memcpy(__dest,__src,__size);
    pJVar3->size = uVar7;
    pJVar3->next = (JoypadChunk *)pJVar2;
    pJVar3->prev = (JoypadChunk *)pJVar2;
    (pJVar2->sentinel).next = pJVar3;
    (pJVar2->sentinel).prev = pJVar3;
    *out_buffer = pJVar2;
    RVar1 = OK;
  }
  else {
    joypad_read_cold_1();
LAB_0019b571:
    RVar1 = ERROR;
  }
  return RVar1;
}

Assistant:

Result joypad_read(const FileData* file_data, JoypadBuffer** out_buffer) {
  CHECK_MSG(file_data->size % sizeof(JoypadState) == 0,
            "Expected joypad file size to be multiple of %zu\n",
            sizeof(JoypadState));
  size_t size = file_data->size / sizeof(JoypadState);
  size_t i;
  Ticks last_ticks = 0;
  for (i = 0; i < size; ++i) {
    JoypadState* state = (JoypadState*)file_data->data + i;
    Ticks ticks = state->ticks;
    CHECK_MSG(ticks >= last_ticks,
              "Expected ticks to be sorted, got %" PRIu64 " then %" PRIu64 "\n",
              last_ticks, ticks);
    size_t j;
    for (j = 0; j < ARRAY_SIZE(state->padding); ++j) {
      CHECK_MSG(state->padding[j] == 0, "Expected padding to be zero, got %u\n",
                state->padding[i]);
    }
    last_ticks = ticks;
  }

  JoypadBuffer* buffer = xcalloc(1, sizeof(JoypadBuffer));
  JoypadChunk* new_chunk = alloc_joypad_chunk(size);
  memcpy(new_chunk->data, file_data->data, file_data->size);
  new_chunk->size = size;
  new_chunk->prev = new_chunk->next = &buffer->sentinel;
  buffer->sentinel.prev = buffer->sentinel.next = new_chunk;
  *out_buffer = buffer;
  return OK;
  ON_ERROR_RETURN;
}